

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O1

void __thiscall Code_generator::visit(Code_generator *this,Inst_msr *s)

{
  Register *pRVar1;
  string local_40;
  
  ast::Instruction::check_alignment(&s->super_Instruction);
  pRVar1 = s->rd;
  if ((pRVar1->n & 0xfffffffe) != 0x12e) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Invalid register","");
    error_report(&pRVar1->location,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  ast::Sections::write16
            ((s->super_Instruction).super_Statement.section_index,
             (s->super_Instruction).super_Statement.section_offset,
             (ushort)(s->rs->n << 7) | (ushort)(s->rd->n == 0x12f) << 4 | 0xb040);
  return;
}

Assistant:

void Code_generator::visit(Inst_msr *s)
{
	s->check_alignment();
	if (s->rd->n != CPSR && s->rd->n != SPSR)
		error_report(&s->rd->location, "Invalid register");
	Sections::write16(s->section_index, s->section_offset,
		static_cast<uint16_t>(MSR_OPCODE 
			| ((s->rd->n == SPSR) << SPSR_INDICATION_POSITION)
			| (s->rs->n << MOV_RS_POSITION)));
}